

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O1

if2ip_result_t Curl_if2ip(int af,uint remote_scope,char *interf,char *buf,int buf_size)

{
  int __fd;
  int iVar1;
  size_t sVar2;
  if2ip_result_t iVar3;
  in_addr in;
  undefined4 local_5c;
  undefined1 local_58;
  undefined1 auStack_57 [15];
  ushort local_48;
  undefined4 local_44;
  
  iVar3 = IF2IP_NOT_FOUND;
  if (af == 2 && interf != (char *)0x0) {
    sVar2 = strlen(interf);
    iVar3 = IF2IP_NOT_FOUND;
    if (sVar2 < 0x10) {
      iVar3 = IF2IP_NOT_FOUND;
      __fd = socket(2,1,0);
      if (__fd != -1) {
        iVar3 = IF2IP_NOT_FOUND;
        memset(auStack_57 + sVar2,0,0x27 - sVar2);
        memcpy(&local_58,interf,sVar2 + 1);
        local_48 = 2;
        iVar1 = ioctl(__fd,0x8915,&local_58);
        if (-1 < iVar1) {
          local_5c = local_44;
          Curl_inet_ntop((uint)local_48,&local_5c,buf,(long)buf_size);
          iVar3 = IF2IP_FOUND;
        }
        close(__fd);
      }
    }
  }
  return iVar3;
}

Assistant:

if2ip_result_t Curl_if2ip(int af, unsigned int remote_scope,
                          const char *interf, char *buf, int buf_size)
{
  struct ifreq req;
  struct in_addr in;
  struct sockaddr_in *s;
  curl_socket_t dummy;
  size_t len;

  (void)remote_scope;

  if(!interf || (af != AF_INET))
    return IF2IP_NOT_FOUND;

  len = strlen(interf);
  if(len >= sizeof(req.ifr_name))
    return IF2IP_NOT_FOUND;

  dummy = socket(AF_INET, SOCK_STREAM, 0);
  if(CURL_SOCKET_BAD == dummy)
    return IF2IP_NOT_FOUND;

  memset(&req, 0, sizeof(req));
  memcpy(req.ifr_name, interf, len+1);
  req.ifr_addr.sa_family = AF_INET;

  if(ioctl(dummy, SIOCGIFADDR, &req) < 0) {
    sclose(dummy);
    /* With SIOCGIFADDR, we cannot tell the difference between an interface
       that does not exist and an interface that has no address of the
       correct family. Assume the interface does not exist */
    return IF2IP_NOT_FOUND;
  }

  s = (struct sockaddr_in *)&req.ifr_addr;
  memcpy(&in, &s->sin_addr, sizeof(in));
  Curl_inet_ntop(s->sin_family, &in, buf, buf_size);

  sclose(dummy);
  return IF2IP_FOUND;
}